

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

JSONArray * __thiscall JSON::JSONValue::getArrayValue(JSONValue *this)

{
  ostream *poVar1;
  string local_38;
  
  if (this->type != ARRAY) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error requesting JSON array value from ",0x27);
    getTypeAsString_abi_cxx11_(&local_38,this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (JSONArray *)this->data;
}

Assistant:

const JSONArray &JSONValue::getArrayValue() const {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=ARRAY)
	cerr << "Error requesting JSON array value from " << getTypeAsString() << endl;
#endif

	return *((JSONArray*)data);
}